

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O3

void __thiscall
OpenMD::RNEMD::SPFMethod::isValidExchange
          (SPFMethod *this,Vector3d *v_a,Vector3d *v_b,RealType *a,RealType *b)

{
  double dVar1;
  RealType RVar2;
  undefined1 auVar3 [16];
  uint i;
  int iVar4;
  long lVar5;
  SPFMethod *this_00;
  double tmp;
  double dVar6;
  double tmp_2;
  double dVar7;
  double tmp_1;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector<double,_3U> result;
  double local_b8 [4];
  double local_98;
  double dStack_90;
  SlabThermodynamics local_80;
  SlabThermodynamics local_58;
  
  this_00 = (SPFMethod *)v_a;
  calculateSlabTherodynamicQuantities(&local_58,(SPFMethod *)v_a,&this->smanA_);
  calculateSlabTherodynamicQuantities(&local_80,this_00,&this->smanB_);
  RVar2 = SPFForceManager::getScaledDeltaU(this->forceManager_);
  if ((0.0 < local_58.M) && (0.0 < local_80.M)) {
    dVar9 = RVar2 * 0.0004184;
    local_b8[0] = 0.0;
    local_b8[1] = 0.0;
    local_b8[2] = 0.0;
    lVar5 = 0;
    do {
      local_b8[lVar5] = local_58.P.super_Vector<double,_3U>.data_[lVar5] / local_58.M;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    (v_a->super_Vector<double,_3U>).data_[2] = local_b8[2];
    (v_a->super_Vector<double,_3U>).data_[0] = local_b8[0];
    (v_a->super_Vector<double,_3U>).data_[1] = local_b8[1];
    local_b8[0] = 0.0;
    local_b8[1] = 0.0;
    local_b8[2] = 0.0;
    lVar5 = 0;
    do {
      local_b8[lVar5] = local_80.P.super_Vector<double,_3U>.data_[lVar5] / local_80.M;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    (v_b->super_Vector<double,_3U>).data_[2] = local_b8[2];
    (v_b->super_Vector<double,_3U>).data_[0] = local_b8[0];
    (v_b->super_Vector<double,_3U>).data_[1] = local_b8[1];
    if (this->uniformKineticScaling_ == true) {
      dVar6 = 0.0;
      lVar5 = 0;
      do {
        dVar8 = (v_a->super_Vector<double,_3U>).data_[lVar5];
        dVar6 = dVar6 + dVar8 * dVar8;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      dVar8 = 0.0;
      lVar5 = 0;
      do {
        dVar7 = (v_b->super_Vector<double,_3U>).data_[lVar5];
        dVar8 = dVar8 + dVar7 * dVar7;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      dVar9 = dVar9 / (local_80.M * -0.5 * dVar8 +
                      local_58.M * -0.5 * dVar6 + local_58.K + local_80.K) + 1.0;
      if (dVar9 <= 0.0) {
        return;
      }
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      *a = dVar9;
    }
    else {
      dVar6 = (this->super_RNEMD).kineticTarget_;
      dVar8 = 0.0;
      lVar5 = 0;
      do {
        dVar7 = (v_a->super_Vector<double,_3U>).data_[lVar5];
        dVar8 = dVar8 + dVar7 * dVar7;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      dVar7 = 0.0;
      lVar5 = 0;
      do {
        dVar1 = (v_b->super_Vector<double,_3U>).data_[lVar5];
        dVar7 = dVar7 + dVar1 * dVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      auVar10._0_8_ = dVar9 + dVar6;
      auVar10._8_8_ = dVar9 - dVar6;
      auVar3._8_8_ = (local_58.K + local_58.K) - local_58.M * dVar8;
      auVar3._0_8_ = (local_80.K + local_80.K) - local_80.M * dVar7;
      auVar11 = divpd(auVar10,auVar3);
      dVar9 = auVar11._0_8_ + 1.0;
      dVar6 = auVar11._8_8_ + 1.0;
      auVar11._8_4_ = (int)-(ulong)(0.0 < dVar6);
      auVar11._0_8_ = -(ulong)(0.0 < dVar9);
      auVar11._12_4_ = (int)(-(ulong)(0.0 < dVar6) >> 0x20);
      iVar4 = movmskpd(3,auVar11);
      if (iVar4 != 3) {
        return;
      }
      if (dVar6 < 0.0) {
        local_98 = dVar9;
        dStack_90 = dVar6;
        dVar6 = sqrt(dVar6);
        dVar9 = local_98;
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      *a = dVar6;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
    }
    *b = dVar9;
  }
  return;
}

Assistant:

void SPFMethod::isValidExchange(Vector3d& v_a, Vector3d& v_b, RealType& a,
                                  RealType& b) {
    const auto& [P_a, M_a, K_a] = calculateSlabTherodynamicQuantities(smanA_);
    const auto& [P_b, M_b, K_b] = calculateSlabTherodynamicQuantities(smanB_);

    RealType deltaU =
        Constants::energyConvert * forceManager_->getScaledDeltaU();

    if ((M_a > 0.0) && (M_b > 0.0)) {  // both slabs are not empty
      v_a = P_a / M_a;
      v_b = P_b / M_b;

      if (uniformKineticScaling_) {
        RealType numerator   = deltaU;
        RealType denominator = K_a + K_b;
        denominator -= 0.5 * M_a * v_a.lengthSquare();
        denominator -= 0.5 * M_b * v_b.lengthSquare();

        RealType a2 = (numerator / denominator) + 1.0;

        if (a2 > 0.0) {
          a = std::sqrt(a2);
          b = a;
        }
      } else {
        RealType aNumerator   = deltaU - kineticTarget_;
        RealType aDenominator = 2.0 * K_a;
        aDenominator -= M_a * v_a.lengthSquare();

        RealType bNumerator   = deltaU + kineticTarget_;
        RealType bDenominator = 2.0 * K_b;
        bDenominator -= M_b * v_b.lengthSquare();

        RealType a2 = (aNumerator / aDenominator) + 1.0;
        RealType b2 = (bNumerator / bDenominator) + 1.0;

        if (a2 > 0.0 && b2 > 0.0) {
          a = std::sqrt(a2);
          b = std::sqrt(b2);
        }
      }
    }
  }